

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall Js::StepController::ResetReturnedValueList(StepController *this)

{
  StepController *this_local;
  
  this->returnedValueRecordingDepth = 0;
  if (this->returnedValueList != (ReturnedValueList *)0x0) {
    JsUtil::
    List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ClearAndZero(this->returnedValueList);
  }
  return;
}

Assistant:

void StepController::ResetReturnedValueList()
    {
        returnedValueRecordingDepth = 0;
        if (this->returnedValueList != nullptr)
        {
            this->returnedValueList->ClearAndZero();
        }
    }